

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

int noconflict(ASMState *as,IRRef ref,IROp conflict,int check)

{
  byte bVar1;
  IRRef i;
  IROp IVar2;
  ulong uVar3;
  byte in_R8B;
  
  uVar3 = (ulong)ref;
  if (ref <= conflict + IR_BNOT) {
    do {
      IVar2 = (int)uVar3 - IR_GE;
      if (IVar2 <= conflict) {
        return 1;
      }
      uVar3 = (ulong)IVar2;
      bVar1 = *(byte *)((long)as->cost + uVar3 * 8 + 5);
    } while ((((uint)bVar1 != check) &&
             (((in_R8B & 1) == 0 || ((bVar1 != 0x3b && (bVar1 != 0x62)))))) &&
            (((in_R8B & 2) == 0 ||
             (((ushort)as->cost[uVar3 * 2] != conflict &&
              (*(ushort *)((long)as->cost + uVar3 * 8 + 2) != conflict))))));
  }
  return 0;
}

Assistant:

static int noconflict(ASMState *as, IRRef ref, IROp conflict, int check)
{
  IRIns *ir = as->ir;
  IRRef i = as->curins;
  if (i > ref + CONFLICT_SEARCH_LIM)
    return 0;  /* Give up, ref is too far away. */
  while (--i > ref) {
    if (ir[i].o == conflict)
      return 0;  /* Conflict found. */
    else if ((check & 1) && (ir[i].o == IR_NEWREF || ir[i].o == IR_CALLS))
      return 0;
    else if ((check & 2) && (ir[i].op1 == ref || ir[i].op2 == ref))
      return 0;
  }
  return 1;  /* Ok, no conflict. */
}